

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrans.cpp
# Opt level: O1

void init_windows(void)

{
  Am_Drawonable *pAVar1;
  Am_Style aAStack_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  
  pAVar1 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  root = pAVar1;
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  d1 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x352,0xb4,0xdc,100,"D1","",1,0,local_30,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_30);
  pAVar1 = d1;
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0xfffffff1,0x16,0xaf,100,"D2","",1,0,local_38,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_38);
  pAVar1 = d2;
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  d3 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x1e,0x12,0x96,100,"D3","",1,0,local_40,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_40);
  pAVar1 = root;
  Am_Style::Am_Style(aAStack_48,(Am_Style *)&Am_No_Style);
  d4 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,800,0x140,0x96,100,"D4","",1,0,aAStack_48,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(aAStack_48);
  (**(code **)(*(long *)d1 + 0x1b0))(d1,&Global_Handlers);
  (**(code **)(*(long *)d2 + 0x1b0))(d2,&Global_Handlers);
  (**(code **)(*(long *)d3 + 0x1b0))(d3,&Global_Handlers);
  (**(code **)(*(long *)d4 + 0x1b0))(d4,&Global_Handlers);
  return;
}

Assistant:

void
init_windows()
{
  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(850, 180, 220, 100, "D1");
  d2 = d1->Create(-15, 22, 175, 100, "D2");
  d3 = d2->Create(30, 18, 150, 100, "D3");
  d4 = root->Create(800, 320, 150, 100, "D4");

  d1->Set_Input_Dispatch_Functions(&Global_Handlers);
  d2->Set_Input_Dispatch_Functions(&Global_Handlers);
  d3->Set_Input_Dispatch_Functions(&Global_Handlers);
  d4->Set_Input_Dispatch_Functions(&Global_Handlers);
}